

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall kratos::Simulator::process_stmt(Simulator *this,StmtBlock *block,Var *var)

{
  bool bVar1;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *stmt_00;
  shared_ptr<kratos::Stmt> *stmt;
  iterator __end1;
  iterator __begin1;
  StmtBlock *__range1;
  Var *var_local;
  StmtBlock *block_local;
  Simulator *this_local;
  
  __end1 = StmtBlock::begin(block);
  stmt = (shared_ptr<kratos::Stmt> *)StmtBlock::end(block);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                *)&stmt);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
               ::operator*(&__end1)->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
    stmt_00 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    process_stmt(this,stmt_00,var);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Simulator::process_stmt(kratos::StmtBlock *block, const Var *var) {
    for (auto &stmt : *block) {
        process_stmt(stmt.get(), var);
    }
}